

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::SubjectFactoryTest_test_setting_ndf_with_Tenor_and_settlement_Test
::~SubjectFactoryTest_test_setting_ndf_with_Tenor_and_settlement_Test
          (SubjectFactoryTest_test_setting_ndf_with_Tenor_and_settlement_Test *this)

{
  SubjectFactoryTest_test_setting_ndf_with_Tenor_and_settlement_Test *this_local;
  
  ~SubjectFactoryTest_test_setting_ndf_with_Tenor_and_settlement_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_setting_ndf_with_Tenor_and_settlement)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    ASSERT_STREQ(
            "AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=EUR,DealType=NDF,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,SettlementDate=20180923,Symbol=EURGBP,Tenor=1M,User=fbennett",
            subject_factory.Fx().Stream().Ndf()
                    .LiquidityProvider("CSFX")
                    .CurrencyPair("EURGBP")
                    .Currency("EUR")
                    .Quantity(1000000)
                    .Tenor(Tenor::IN_1_MONTH)
                    .SettlementDate(new Date(2018, 9, 23))
                    .CreateSubject()
                    .ToString().c_str());
}